

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStructNew
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,StructNew *curr)

{
  size_t sVar1;
  long lVar2;
  Expression **ppEVar3;
  Literal *pLVar4;
  uint uVar5;
  ulong index;
  HeapType heapType;
  Literal local_c0;
  Literal local_a8;
  undefined1 local_90 [8];
  Literals data;
  
  if (*(long *)(curr + 8) == 1) {
    data.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    sVar1 = *(size_t *)(curr + 0x18);
    local_90 = (undefined1  [8])(curr + 0x10);
    while( true ) {
      if ((data.super_SmallVector<wasm::Literal,_1UL>.usedFixed == sVar1) &&
         (local_90 == (undefined1  [8])(curr + 0x10))) {
        wasm::handle_unreachable
                  ("unreachable but no unreachable child",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                   ,0x6c2);
      }
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)local_90);
      visit(__return_storage_ptr__,this,*ppEVar3);
      if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0) break;
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__);
      data.super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           data.super_SmallVector<wasm::Literal,_1UL>.usedFixed + 1;
    }
  }
  else {
    Type::getHeapType((Type *)(curr + 8));
    data.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)wasm::HeapType::getStruct();
    SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)local_90,
               (long)((data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage)->field_0).gcData.
                     super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               - ((data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage)->field_0).i64 >> 4);
    uVar5 = 0;
    while( true ) {
      index = (ulong)uVar5;
      lVar2 = ((data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage)->field_0).i64;
      if ((ulong)((long)((data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage)->field_0).gcData.
                        super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi - lVar2 >> 4) <= index) break;
      if (*(long *)(curr + 0x18) == 0) {
        wasm::Literal::makeZero((Type)&local_c0);
        pLVar4 = (Literal *)
                 ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18) +
                 index * 0x18);
        if (index == 0) {
          pLVar4 = (Literal *)&data;
        }
        wasm::Literal::operator=(pLVar4,&local_c0);
        wasm::Literal::~Literal(&local_c0);
      }
      else {
        ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )(curr + 0x10),index);
        visit(__return_storage_ptr__,this,*ppEVar3);
        if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0)
        goto LAB_001410a7;
        pLVar4 = Flow::getSingleValue(__return_storage_ptr__);
        wasm::Literal::Literal((Literal *)&heapType,pLVar4);
        truncateForPacking(&local_c0,this,(Literal *)&heapType,(Field *)(lVar2 + index * 0x10));
        pLVar4 = (Literal *)
                 ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18) +
                 index * 0x18);
        if (index == 0) {
          pLVar4 = (Literal *)&data;
        }
        wasm::Literal::operator=(pLVar4,&local_c0);
        wasm::Literal::~Literal(&local_c0);
        wasm::Literal::~Literal((Literal *)&heapType);
        SmallVector<wasm::Literal,_1UL>::~SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__);
      }
      uVar5 = uVar5 + 1;
    }
    makeGCData(&local_a8,this,(Literals *)local_90,(Type)*(uintptr_t *)(curr + 8));
    Flow::Flow(__return_storage_ptr__,&local_a8);
    wasm::Literal::~Literal(&local_a8);
LAB_001410a7:
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

Flow visitStructNew(StructNew* curr) {
    NOTE_ENTER("StructNew");
    if (curr->type == Type::unreachable) {
      // We cannot proceed to compute the heap type, as there isn't one. Just
      // find why we are unreachable, and stop there.
      for (auto* operand : curr->operands) {
        auto value = self()->visit(operand);
        if (value.breaking()) {
          return value;
        }
      }
      WASM_UNREACHABLE("unreachable but no unreachable child");
    }
    auto heapType = curr->type.getHeapType();
    const auto& fields = heapType.getStruct().fields;
    Literals data(fields.size());
    for (Index i = 0; i < fields.size(); i++) {
      auto& field = fields[i];
      if (curr->isWithDefault()) {
        data[i] = Literal::makeZero(field.type);
      } else {
        auto value = self()->visit(curr->operands[i]);
        if (value.breaking()) {
          return value;
        }
        data[i] = truncateForPacking(value.getSingleValue(), field);
      }
    }
    return makeGCData(std::move(data), curr->type);
  }